

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3RenameMethod(sqlite3_vtab *pVtab,char *zName)

{
  sqlite3 *db_00;
  Fts3Table *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  sqlite3 *db;
  Fts3Table *p;
  int rc;
  Fts3Table *in_stack_ffffffffffffffc0;
  int *pRc;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  db_00 = *(sqlite3 **)(in_RDI + 0x18);
  local_c = -0x55555556;
  local_c = fts3SetHasStat(in_RSI);
  if (local_c == 0) {
    local_c = sqlite3Fts3PendingTermsFlush(in_stack_ffffffffffffffc0);
  }
  *(undefined1 *)(in_RDI + 0x1d0) = 1;
  if (*(long *)(in_RDI + 0x50) == 0) {
    fts3DbExec(&local_c,db_00,"ALTER TABLE %Q.\'%q_content\'  RENAME TO \'%q_content\';",
               *(undefined8 *)(in_RDI + 0x20),*(undefined8 *)(in_RDI + 0x28),in_RSI);
  }
  if (*(char *)(in_RDI + 0x1ce) != '\0') {
    fts3DbExec(&local_c,db_00,"ALTER TABLE %Q.\'%q_docsize\'  RENAME TO \'%q_docsize\';",
               *(undefined8 *)(in_RDI + 0x20),*(undefined8 *)(in_RDI + 0x28),in_RSI);
  }
  if (*(char *)(in_RDI + 0x1cd) != '\0') {
    fts3DbExec(&local_c,db_00,"ALTER TABLE %Q.\'%q_stat\'  RENAME TO \'%q_stat\';",
               *(undefined8 *)(in_RDI + 0x20),*(undefined8 *)(in_RDI + 0x28),in_RSI);
  }
  pRc = &local_c;
  fts3DbExec(pRc,db_00,"ALTER TABLE %Q.\'%q_segments\' RENAME TO \'%q_segments\';",
             *(undefined8 *)(in_RDI + 0x20),*(undefined8 *)(in_RDI + 0x28),in_RSI);
  fts3DbExec(pRc,db_00,"ALTER TABLE %Q.\'%q_segdir\'   RENAME TO \'%q_segdir\';",
             *(undefined8 *)(in_RDI + 0x20),*(undefined8 *)(in_RDI + 0x28),in_RSI);
  *(undefined1 *)(in_RDI + 0x1d0) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_c;
  }
  __stack_chk_fail();
}

Assistant:

static int fts3RenameMethod(
  sqlite3_vtab *pVtab,            /* Virtual table handle */
  const char *zName               /* New name of table */
){
  Fts3Table *p = (Fts3Table *)pVtab;
  sqlite3 *db = p->db;            /* Database connection */
  int rc;                         /* Return Code */

  /* At this point it must be known if the %_stat table exists or not.
  ** So bHasStat may not be 2.  */
  rc = fts3SetHasStat(p);

  /* As it happens, the pending terms table is always empty here. This is
  ** because an "ALTER TABLE RENAME TABLE" statement inside a transaction
  ** always opens a savepoint transaction. And the xSavepoint() method
  ** flushes the pending terms table. But leave the (no-op) call to
  ** PendingTermsFlush() in in case that changes.
  */
  assert( p->nPendingData==0 );
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts3PendingTermsFlush(p);
  }

  p->bIgnoreSavepoint = 1;

  if( p->zContentTbl==0 ){
    fts3DbExec(&rc, db,
      "ALTER TABLE %Q.'%q_content'  RENAME TO '%q_content';",
      p->zDb, p->zName, zName
    );
  }

  if( p->bHasDocsize ){
    fts3DbExec(&rc, db,
      "ALTER TABLE %Q.'%q_docsize'  RENAME TO '%q_docsize';",
      p->zDb, p->zName, zName
    );
  }
  if( p->bHasStat ){
    fts3DbExec(&rc, db,
      "ALTER TABLE %Q.'%q_stat'  RENAME TO '%q_stat';",
      p->zDb, p->zName, zName
    );
  }
  fts3DbExec(&rc, db,
    "ALTER TABLE %Q.'%q_segments' RENAME TO '%q_segments';",
    p->zDb, p->zName, zName
  );
  fts3DbExec(&rc, db,
    "ALTER TABLE %Q.'%q_segdir'   RENAME TO '%q_segdir';",
    p->zDb, p->zName, zName
  );

  p->bIgnoreSavepoint = 0;
  return rc;
}